

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_special_functions.cc
# Opt level: O2

basic_ostream<char,_std::char_traits<char>_> *
operator<<(basic_ostream<char,_std::char_traits<char>_> *out,args<double,_3UL> *x)

{
  long lVar1;
  
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    std::ostream::_M_insert<double>((x->super_array<double,_3UL>)._M_elems[lVar1]);
    if (lVar1 != 2) {
      std::operator<<(out,", ");
    }
  }
  return out;
}

Assistant:

std::basic_ostream<CharT, TraitT> &operator<<(std::basic_ostream<CharT, TraitT> &out,
                                                       const args &x) {
    for (std::size_t i{0}; i < x.size(); ++i) {
      out << x[i];
      if (i + 1 < n)
        out << ", ";
    }
    return out;
  }